

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O2

int __thiscall io_buf::init(io_buf *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  
  (this->space).end_array = (char *)0x0;
  (this->space).erase_count = 0;
  (this->space)._begin = (char *)0x0;
  (this->space)._end = (char *)0x0;
  (this->files)._begin = (int *)0x0;
  (this->files)._end = (int *)0x0;
  (this->files).end_array = (int *)0x0;
  (this->files).erase_count = 0;
  (this->currentname)._begin = (char *)0x0;
  (this->currentname)._end = (char *)0x0;
  (this->currentname).end_array = (char *)0x0;
  (this->currentname).erase_count = 0;
  (this->finalname)._begin = (char *)0x0;
  (this->finalname)._end = (char *)0x0;
  (this->finalname).end_array = (char *)0x0;
  (this->finalname).erase_count = 0;
  v_array<char>::resize(&this->space,0x10000);
  this->count = 0;
  this->current = 0;
  pcVar1 = (this->space)._begin;
  this->head = pcVar1;
  this->_verify_hash = false;
  this->_hash = 0;
  return (int)pcVar1;
}

Assistant:

void init()
  {
    space = v_init<char>();
    files = v_init<int>();
    currentname = v_init<char>();
    finalname = v_init<char>();
    size_t s = 1 << 16;
    space.resize(s);
    current = 0;
    count = 0;
    head = space.begin();
    _verify_hash = false;
    _hash = 0;
  }